

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void flatbuffers::kotlin::KotlinGenerator::GenerateFunOneLine
               (CodeWriter *writer,string *name,string *params,string *returnType,
               function<void_()> *body,bool gen_jvmstatic)

{
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"name",(allocator<char> *)&local_70);
  CodeWriter::SetValue(writer,&local_90,name);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"params",(allocator<char> *)&local_70);
  CodeWriter::SetValue(writer,&local_90,params);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"return_type_p",&local_91);
  if (returnType->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_92);
  }
  else {
    std::operator+(&local_70," : ",returnType);
  }
  CodeWriter::SetValue(writer,&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  GenerateJvmStaticAnnotation(writer,gen_jvmstatic);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"fun {{name}}({{params}}){{return_type_p}} = \\",
             (allocator<char> *)&local_90);
  CodeWriter::operator+=(writer,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::function<void_()>::operator()(body);
  return;
}

Assistant:

static void GenerateFunOneLine(CodeWriter &writer, const std::string &name,
                                 const std::string &params,
                                 const std::string &returnType,
                                 const std::function<void()> &body,
                                 bool gen_jvmstatic = false) {
    // Generates Kotlin function
    // e.g.:
    // fun path(j: Int): Vec3 = return path(Vec3(), j)
    writer.SetValue("name", name);
    writer.SetValue("params", params);
    writer.SetValue("return_type_p",
                    returnType.empty() ? "" : " : " + returnType);
    GenerateJvmStaticAnnotation(writer, gen_jvmstatic);
    writer += "fun {{name}}({{params}}){{return_type_p}} = \\";
    body();
  }